

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

RtreeNode * nodeNew(Rtree *pRtree,RtreeNode *pParent)

{
  int iVar1;
  int iVar2;
  RtreeNode *__s;
  
  iVar1 = pRtree->iNodeSize;
  iVar2 = sqlite3_initialize();
  if ((iVar2 == 0) &&
     (__s = (RtreeNode *)sqlite3Malloc((long)iVar1 + 0x28), __s != (RtreeNode *)0x0)) {
    memset(__s,0,(long)pRtree->iNodeSize + 0x28);
    __s->zData = (u8 *)(__s + 1);
    __s->nRef = 1;
    pRtree->nNodeRef = pRtree->nNodeRef + 1;
    __s->pParent = pParent;
    __s->isDirty = 1;
    if (pParent == (RtreeNode *)0x0) {
      return __s;
    }
    pParent->nRef = pParent->nRef + 1;
    return __s;
  }
  return (RtreeNode *)0x0;
}

Assistant:

static RtreeNode *nodeNew(Rtree *pRtree, RtreeNode *pParent){
  RtreeNode *pNode;
  pNode = (RtreeNode *)sqlite3_malloc64(sizeof(RtreeNode) + pRtree->iNodeSize);
  if( pNode ){
    memset(pNode, 0, sizeof(RtreeNode) + pRtree->iNodeSize);
    pNode->zData = (u8 *)&pNode[1];
    pNode->nRef = 1;
    pRtree->nNodeRef++;
    pNode->pParent = pParent;
    pNode->isDirty = 1;
    nodeReference(pParent);
  }
  return pNode;
}